

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O3

void __thiscall
asio::detail::
reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>_>,_asio::any_io_executor>
::reactive_socket_recv_op
          (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>_>,_asio::any_io_executor>
           *this,error_code *success_ec,socket_type socket,state_type state,
          mutable_buffers_1 *buffers,message_flags flags,
          io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>_>
          *handler,any_io_executor *io_ex)

{
  error_category *peVar1;
  size_t sVar2;
  undefined4 uVar3;
  want wVar4;
  
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  super_operation.next_ = (scheduler_operation *)0x0;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  super_operation.func_ = do_complete;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  super_operation.task_result_ = 0;
  uVar3 = *(undefined4 *)&success_ec->field_0x4;
  peVar1 = success_ec->_M_cat;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_._M_value
       = success_ec->_M_value;
  *(undefined4 *)
   &(this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_.
    field_0x4 = uVar3;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_._M_cat =
       peVar1;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  cancellation_key_ = (void *)0x0;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  bytes_transferred_ = 0;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.perform_func_
       = reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).socket_ = socket;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).state_ = state;
  sVar2 = (buffers->super_mutable_buffer).size_;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).buffers_.super_mutable_buffer.
  data_ = (buffers->super_mutable_buffer).data_;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).buffers_.super_mutable_buffer.
  size_ = sVar2;
  (this->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).flags_ = flags;
  (this->handler_).next_layer_ = handler->next_layer_;
  (this->handler_).core_ = handler->core_;
  sVar2 = (handler->op_).buffers_.super_mutable_buffer.size_;
  (this->handler_).op_.buffers_.super_mutable_buffer.data_ =
       (handler->op_).buffers_.super_mutable_buffer.data_;
  (this->handler_).op_.buffers_.super_mutable_buffer.size_ = sVar2;
  wVar4 = handler->want_;
  (this->handler_).start_ = handler->start_;
  (this->handler_).want_ = wVar4;
  uVar3 = *(undefined4 *)&(handler->ec_).field_0x4;
  peVar1 = (handler->ec_)._M_cat;
  (this->handler_).ec_._M_value = (handler->ec_)._M_value;
  *(undefined4 *)&(this->handler_).ec_.field_0x4 = uVar3;
  (this->handler_).ec_._M_cat = peVar1;
  (this->handler_).bytes_transferred_ = handler->bytes_transferred_;
  read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>
  ::read_op(&(this->handler_).handler_,&handler->handler_);
  handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
  handler_work_base(&(this->work_).
                     super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                    ,0,0,io_ex);
  return;
}

Assistant:

reactive_socket_recv_op(const asio::error_code& success_ec,
      socket_type socket, socket_ops::state_type state,
      const MutableBufferSequence& buffers, socket_base::message_flags flags,
      Handler& handler, const IoExecutor& io_ex)
    : reactive_socket_recv_op_base<MutableBufferSequence>(success_ec, socket,
        state, buffers, flags, &reactive_socket_recv_op::do_complete),
      handler_(ASIO_MOVE_CAST(Handler)(handler)),
      work_(handler_, io_ex)
  {
  }